

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::dump_nodes(DG2Dot<dg::LLVMNode> *this)

{
  LLVMNode *node;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  pair<std::_Rb_tree_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar7;
  DependenceGraph<dg::LLVMNode> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"\t/* nodes */\n",0xd);
  p_Var4 = (this->dg->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->dg->nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      node = (LLVMNode *)p_Var4[1]._M_parent;
      dump_node(this,node,1,(char *)0x0);
      for (p_Var3 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                    subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
           _M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        local_38 = *(DependenceGraph<dg::LLVMNode> **)(p_Var3 + 1);
        std::
        _Rb_tree<dg::DependenceGraph<dg::LLVMNode>*,dg::DependenceGraph<dg::LLVMNode>*,std::_Identity<dg::DependenceGraph<dg::LLVMNode>*>,std::less<dg::DependenceGraph<dg::LLVMNode>*>,std::allocator<dg::DependenceGraph<dg::LLVMNode>*>>
        ::_M_insert_unique<dg::DependenceGraph<dg::LLVMNode>*>
                  ((_Rb_tree<dg::DependenceGraph<dg::LLVMNode>*,dg::DependenceGraph<dg::LLVMNode>*,std::_Identity<dg::DependenceGraph<dg::LLVMNode>*>,std::less<dg::DependenceGraph<dg::LLVMNode>*>,std::allocator<dg::DependenceGraph<dg::LLVMNode>*>>
                    *)&this->subgraphs,&local_38);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  local_38 = (DependenceGraph<dg::LLVMNode> *)
             (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Var1 = (this->dg->global_nodes).
           super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
    }
  }
  pVar7 = std::
          _Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
          ::
          _M_insert_unique<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>
                    ((_Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
                      *)&this->dumpedGlobals,
                     (map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
                      **)&local_38);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    peVar2 = (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var1 = (this->dg->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    for (p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      dump_node(this,(LLVMNode *)p_Var5[1]._M_parent,1,"GL");
    }
  }
  return;
}

Assistant:

void dump_nodes() {
        out << "\t/* nodes */\n";
        for (auto &I : *dg) {
            auto *node = I.second;

            dump_node(node);

            for (auto subgraph : node->getSubgraphs()) {
                subgraphs.insert(subgraph);
            }
        }

        if (dumpedGlobals.insert(dg->getGlobalNodes().get()).second)
            for (auto &I : *dg->getGlobalNodes())
                dump_node(I.second, 1, "GL");
    }